

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O3

bool __thiscall
google::protobuf::TextFormat::Printer::PrintAny
          (Printer *this,Message *message,TextGenerator *generator)

{
  _Rb_tree_header *p_Var1;
  Finder *pFVar2;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  Descriptor *type;
  Message *pMVar5;
  MessageLite *this_00;
  _Base_ptr p_Var6;
  unique_ptr<const_google::protobuf::TextFormat::FastFieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>
  *puVar7;
  LogMessage *pLVar8;
  Reflection *this_01;
  _Base_ptr p_Var9;
  FieldDescriptor *value_field;
  string full_type_name;
  string url_prefix;
  FieldDescriptor *type_url_field;
  string serialized_value;
  DynamicMessageFactory factory;
  LogFinisher local_141;
  FieldDescriptor *local_140;
  string local_138;
  string local_118;
  FieldDescriptor *local_f8;
  string local_f0;
  string local_d0;
  DynamicMessageFactory local_b0;
  LogMessage local_68;
  undefined4 extraout_var_00;
  
  bVar3 = internal::GetAnyFieldDescriptors(message,&local_f8,&local_140);
  if (!bVar3) {
    return false;
  }
  (*(message->super_MessageLite)._vptr_MessageLite[0x15])(message);
  Reflection::GetString_abi_cxx11_(&local_f0,this_01,message,local_f8);
  local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
  local_118._M_string_length = 0;
  local_118.field_2._M_local_buf[0] = '\0';
  local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
  local_138._M_string_length = 0;
  local_138.field_2._M_local_buf[0] = '\0';
  bVar3 = internal::ParseAnyTypeUrl(&local_f0,&local_118,&local_138);
  if (bVar3) {
    pFVar2 = this->finder_;
    if (pFVar2 == (Finder *)0x0) {
      type = anon_unknown_19::DefaultFinderFindAnyType(message,&local_118,&local_138);
    }
    else {
      iVar4 = (*pFVar2->_vptr_Finder[4])(pFVar2,message,&local_118,&local_138);
      type = (Descriptor *)CONCAT44(extraout_var,iVar4);
    }
    if (type != (Descriptor *)0x0) {
      DynamicMessageFactory::DynamicMessageFactory(&local_b0);
      pMVar5 = DynamicMessageFactory::GetPrototype(&local_b0,type);
      iVar4 = (*(pMVar5->super_MessageLite)._vptr_MessageLite[3])(pMVar5);
      this_00 = (MessageLite *)CONCAT44(extraout_var_00,iVar4);
      Reflection::GetString_abi_cxx11_(&local_d0,this_01,message,local_140);
      bVar3 = MessageLite::ParseFromString(this_00,&local_d0);
      if (bVar3) {
        (*(generator->super_BaseTextGenerator)._vptr_BaseTextGenerator[5])(generator,"[",1);
        (*(generator->super_BaseTextGenerator)._vptr_BaseTextGenerator[5])
                  (generator,local_f0._M_dataplus._M_p,local_f0._M_string_length);
        (*(generator->super_BaseTextGenerator)._vptr_BaseTextGenerator[5])(generator,"]",1);
        p_Var9 = (this->custom_printers_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        if (p_Var9 == (_Base_ptr)0x0) {
LAB_002a2070:
          puVar7 = &this->default_field_value_printer_;
        }
        else {
          p_Var1 = &(this->custom_printers_)._M_t._M_impl.super__Rb_tree_header;
          p_Var6 = &p_Var1->_M_header;
          do {
            if (*(FieldDescriptor **)(p_Var9 + 1) >= local_140) {
              p_Var6 = p_Var9;
            }
            p_Var9 = (&p_Var9->_M_left)[*(FieldDescriptor **)(p_Var9 + 1) < local_140];
          } while (p_Var9 != (_Base_ptr)0x0);
          if (((_Rb_tree_header *)p_Var6 == p_Var1) ||
             (local_140 < *(FieldDescriptor **)(p_Var6 + 1))) goto LAB_002a2070;
          puVar7 = (unique_ptr<const_google::protobuf::TextFormat::FastFieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>
                    *)&p_Var6[1]._M_parent;
        }
        p_Var9 = (_Base_ptr)
                 (puVar7->_M_t).
                 super___uniq_ptr_impl<const_google::protobuf::TextFormat::FastFieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_const_google::protobuf::TextFormat::FastFieldValuePrinter_*,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>
                 .
                 super__Head_base<0UL,_const_google::protobuf::TextFormat::FastFieldValuePrinter_*,_false>
                 ._M_head_impl;
        (**(code **)(*(long *)&p_Var9->_M_color + 0x70))
                  (p_Var9,message,0xffffffff,0,(ulong)this->single_line_mode_,generator);
        (*(generator->super_BaseTextGenerator)._vptr_BaseTextGenerator[2])(generator);
        Print(this,(Message *)this_00,generator);
        (*(generator->super_BaseTextGenerator)._vptr_BaseTextGenerator[3])(generator);
        (**(code **)(*(long *)&p_Var9->_M_color + 0x78))
                  (p_Var9,message,0xffffffff,0,(ulong)this->single_line_mode_,generator);
      }
      else {
        internal::LogMessage::LogMessage
                  (&local_68,LOGLEVEL_WARNING,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/text_format.cc"
                   ,0x7a0);
        pLVar8 = internal::LogMessage::operator<<(&local_68,&local_f0);
        pLVar8 = internal::LogMessage::operator<<(pLVar8,": failed to parse contents");
        internal::LogFinisher::operator=(&local_141,pLVar8);
        internal::LogMessage::~LogMessage(&local_68);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p);
      }
      (*this_00->_vptr_MessageLite[1])(this_00);
      DynamicMessageFactory::~DynamicMessageFactory(&local_b0);
      goto LAB_002a21ce;
    }
    internal::LogMessage::LogMessage
              ((LogMessage *)&local_b0,LOGLEVEL_WARNING,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/text_format.cc"
               ,0x798);
    pLVar8 = internal::LogMessage::operator<<((LogMessage *)&local_b0,"Proto type ");
    pLVar8 = internal::LogMessage::operator<<(pLVar8,&local_f0);
    pLVar8 = internal::LogMessage::operator<<(pLVar8," not found");
    internal::LogFinisher::operator=((LogFinisher *)&local_68,pLVar8);
    internal::LogMessage::~LogMessage((LogMessage *)&local_b0);
  }
  bVar3 = false;
LAB_002a21ce:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p);
  }
  return bVar3;
}

Assistant:

bool TextFormat::Printer::PrintAny(const Message& message,
                                   TextGenerator* generator) const {
  const FieldDescriptor* type_url_field;
  const FieldDescriptor* value_field;
  if (!internal::GetAnyFieldDescriptors(message, &type_url_field,
                                        &value_field)) {
    return false;
  }

  const Reflection* reflection = message.GetReflection();

  // Extract the full type name from the type_url field.
  const std::string& type_url = reflection->GetString(message, type_url_field);
  std::string url_prefix;
  std::string full_type_name;
  if (!internal::ParseAnyTypeUrl(type_url, &url_prefix, &full_type_name)) {
    return false;
  }

  // Print the "value" in text.
  const Descriptor* value_descriptor =
      finder_ ? finder_->FindAnyType(message, url_prefix, full_type_name)
              : DefaultFinderFindAnyType(message, url_prefix, full_type_name);
  if (value_descriptor == nullptr) {
    GOOGLE_LOG(WARNING) << "Proto type " << type_url << " not found";
    return false;
  }
  DynamicMessageFactory factory;
  std::unique_ptr<Message> value_message(
      factory.GetPrototype(value_descriptor)->New());
  std::string serialized_value = reflection->GetString(message, value_field);
  if (!value_message->ParseFromString(serialized_value)) {
    GOOGLE_LOG(WARNING) << type_url << ": failed to parse contents";
    return false;
  }
  generator->PrintLiteral("[");
  generator->PrintString(type_url);
  generator->PrintLiteral("]");
  const FastFieldValuePrinter* printer = GetFieldPrinter(value_field);
  printer->PrintMessageStart(message, -1, 0, single_line_mode_, generator);
  generator->Indent();
  Print(*value_message, generator);
  generator->Outdent();
  printer->PrintMessageEnd(message, -1, 0, single_line_mode_, generator);
  return true;
}